

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

uint Js::FunctionBody::GetReducedLoopInterpretCount(void)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = DAT_015b8ee8;
  bVar2 = ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Configuration::Global,LoopInterpretCountFlag);
  uVar4 = uVar1;
  if (!bVar2) {
    uVar3 = (DAT_015bbe4c ^ 1) * 9 + 0x10;
    if (uVar3 < uVar1) {
      uVar4 = uVar3;
    }
    if (uVar4 < uVar1 / 3) {
      uVar4 = uVar1 / 3;
    }
  }
  return uVar4;
}

Assistant:

uint FunctionBody::GetReducedLoopInterpretCount()
    {
        const uint loopInterpretCount = CONFIG_FLAG(LoopInterpretCount);
        if(CONFIG_ISENABLED(LoopInterpretCountFlag))
        {
            return loopInterpretCount;
        }
        return max(loopInterpretCount / 3, GetMinLoopProfileIterations(loopInterpretCount));
    }